

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lu_decomp.c
# Opt level: O1

void invert_U8(uchar *U,int n)

{
  ulong uVar1;
  bool bVar2;
  byte bVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  char cVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  
  if (1 < n) {
    uVar8 = (uint)n >> 3;
    uVar6 = (ulong)(n + -2);
    do {
      uVar4 = (uint)uVar6;
      if (0 < (int)uVar4) {
        uVar9 = (ulong)(uVar4 + 1 >> 3);
        cVar7 = (char)(0x100 >> ((byte)(uVar4 + 1) & 7));
        uVar13 = uVar6;
        do {
          uVar1 = uVar13 - 1;
          iVar5 = (int)uVar1 * n;
          iVar10 = iVar5 + 7;
          if (-1 < iVar5) {
            iVar10 = iVar5;
          }
          bVar3 = -((U[(int)((iVar10 >> 3) + ((uint)(uVar6 >> 3) & 0x1fffffff))] >> (~uVar4 & 7) & 1
                    ) != 0);
          if ((int)(uVar4 + 9) < n) {
            uVar11 = n - 1;
            do {
              U[(ulong)(uVar11 >> 3) + uVar1 * uVar8] =
                   U[(ulong)(uVar11 >> 3) + uVar1 * uVar8] ^
                   U[(ulong)(uVar11 >> 3) + (ulong)(uVar8 * uVar4)] & bVar3;
              uVar11 = uVar11 - 8;
            } while ((int)(uVar4 + 9) <= (int)uVar11);
          }
          lVar12 = uVar1 * uVar8;
          U[lVar12 + uVar9] =
               (bVar3 & U[uVar8 * uVar4 + uVar9] ^ U[lVar12 + uVar9]) & cVar7 - 1U |
               U[lVar12 + uVar9] & -cVar7;
          bVar2 = 1 < (long)uVar13;
          uVar13 = uVar1;
        } while (bVar2);
      }
      uVar6 = uVar6 - 1;
    } while (0 < (int)uVar4);
  }
  return;
}

Assistant:

void invert_U8(unsigned char *U, int n)
{
  /*
   * inversion == backwards substitution
   *
   * For all columns c = n-1 ... 0
   *   For all rows c-1 ... 0
   *     add (row c) * (leading (c'th) element of row r) to row r.
   *       only do it for the k elements k = c+1 ... n-1
   */
  for(int c = n-2; c >= 0; c--)
  {
    /*
     * Basically:
     *      copy elements c+1 to n-1 from c'th row to r'th row iff leading element of row r is 1
     */

    for(int r = c-1; r >= 0; r--)
    {
      /*
       * first copy all "full bytes" at the right
       */
      unsigned char mask_rc = 0x00 - ((U[r*n/8 + (c/8)] >> (7 - (c % 8))) & 1); // mask for the element U(r,c)
      for(int k = n-1; k >= c+1 + 8; k -= 8)
      {
        U[r*(n/8) + k/8] ^= mask_rc & U[c*(n/8) + k/8];
      }

      /*
       * then handle the left-most "partial byte"
       */
      int k = c+1;
      unsigned char mask_prepending = (unsigned char) (0x100 >> (k % 8)) - 1;

      unsigned char tmp_rk = U[r*(n/8) + k/8] & ~mask_prepending; // store the left side of the splitted byte in tmp
      U[r*(n/8) + k/8]  ^= (mask_rc & U[c*(n/8) + k/8]);

      // restore the left bits: first set bits 0, then 'or' tmp
      U[r*(n/8) + k/8] &= mask_prepending;
      U[r*(n/8) + k/8] |= tmp_rk;
    }
  }
}